

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

int secp256k1_gej_has_quad_y_var(secp256k1_gej *a)

{
  int iVar1;
  secp256k1_fe yz;
  secp256k1_fe r;
  secp256k1_fe sStack_58;
  secp256k1_fe local_30;
  
  if (a->infinity != 0) {
    return 0;
  }
  secp256k1_fe_mul(&sStack_58,&a->y,&a->z);
  iVar1 = secp256k1_fe_sqrt(&local_30,&sStack_58);
  return iVar1;
}

Assistant:

static int secp256k1_gej_has_quad_y_var(const secp256k1_gej *a) {
    secp256k1_fe yz;

    if (a->infinity) {
        return 0;
    }

    /* We rely on the fact that the Jacobi symbol of 1 / a->z^3 is the same as
     * that of a->z. Thus a->y / a->z^3 is a quadratic residue iff a->y * a->z
       is */
    secp256k1_fe_mul(&yz, &a->y, &a->z);
    return secp256k1_fe_is_quad_var(&yz);
}